

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,MethodDeclaration *ptr)

{
  Type *second;
  Method_args *second_00;
  Body *second_01;
  MethodDeclaration *pMVar1;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  MethodDeclaration *local_18;
  MethodDeclaration *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (MethodDeclaration *)this;
  std::operator+(&local_38,"method decl: ",ptr->name);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pMVar1 = local_18;
  second = local_18->type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"type",&local_69);
  arrow(this,pMVar1,second,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  (**(local_18->type->super_Base)._vptr_Base)(local_18->type,this);
  pMVar1 = local_18;
  second_00 = local_18->args;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"args",&local_91);
  arrow(this,pMVar1,second_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  (**(local_18->args->super_Base)._vptr_Base)(local_18->args,this);
  pMVar1 = local_18;
  second_01 = local_18->body;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"body",&local_b9);
  arrow(this,pMVar1,second_01,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  (**(local_18->body->super_Base)._vptr_Base)(local_18->body,this);
  return;
}

Assistant:

void gv_visitor::visit(MethodDeclaration* ptr) {
    box(ptr, "method decl: " + *ptr->name);
    arrow(ptr, ptr->type, "type");
    ptr->type->accept(this);
    arrow(ptr, ptr->args, "args");
    ptr->args->accept(this);
    arrow(ptr, ptr->body, "body");
    ptr->body->accept(this);
    //name
}